

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O0

void __thiscall directory::split(directory *this,bucket *bucket,int bucket_no)

{
  undefined4 uVar1;
  bool bVar2;
  uint depth;
  int iVar3;
  _Ios_Openmode _Var4;
  reference pvVar5;
  reference piVar6;
  bucket *this_00;
  void *__buf;
  string local_320 [32];
  undefined1 local_300 [8];
  fstream splitBucketFile;
  int _bucket_no;
  index *i;
  iterator __end1;
  iterator __begin1;
  vector<index,_std::allocator<index>_> *__range1;
  __normal_iterator<index_*,_std::vector<index,_std::allocator<index>_>_> local_88;
  __normal_iterator<index_*,_std::vector<index,_std::allocator<index>_>_> local_80;
  undefined1 local_78 [8];
  vector<index,_std::allocator<index>_> copy;
  undefined1 local_50 [8];
  bucket split_bucket;
  int pair_index;
  int dir_depth;
  int local_depth;
  int bucket_no_local;
  bucket *bucket_local;
  directory *this_local;
  
  split_bucket.indices.super__Vector_base<index,_std::allocator<index>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = this->depth;
  ::bucket::increaseDepth(bucket);
  depth = ::bucket::getDepth(bucket);
  ::bucket::bucket((bucket *)local_50);
  local_50._0_4_ = generateBucketId(&this->typeName);
  split_bucket.id = depth;
  split_bucket.indices.super__Vector_base<index,_std::allocator<index>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = pairIndex(this,bucket_no,depth);
  uVar1 = local_50._0_4_;
  if (this->depth < depth) {
    grow(this);
    uVar1 = local_50._0_4_;
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->bucket_ids,
                        (long)(bucket_no +
                              (1 << ((byte)split_bucket.indices.
                                           super__Vector_base<index,_std::allocator<index>_>._M_impl
                                           .super__Vector_impl_data._M_end_of_storage._4_4_ & 0x1f))
                              ));
    *pvVar5 = uVar1;
  }
  else if ((uint)(bucket_no +
                 (1 << ((char)split_bucket.indices.super__Vector_base<index,_std::allocator<index>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ - 1U & 0x1f))
                 ) < this->bucket_size) {
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->bucket_ids,
                        (long)(bucket_no +
                              (1 << ((char)split_bucket.indices.
                                           super__Vector_base<index,_std::allocator<index>_>._M_impl
                                           .super__Vector_impl_data._M_end_of_storage._4_4_ - 1U &
                                    0x1f))));
    *pvVar5 = uVar1;
  }
  else {
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->bucket_ids,(long)bucket_no);
    *pvVar5 = uVar1;
  }
  local_80._M_current = (index *)std::vector<index,_std::allocator<index>_>::begin(&bucket->indices)
  ;
  local_88._M_current = (index *)std::vector<index,_std::allocator<index>_>::end(&bucket->indices);
  this_00 = (bucket *)((long)&__range1 + 7);
  std::allocator<index>::allocator((allocator<index> *)this_00);
  std::vector<index,std::allocator<index>>::
  vector<__gnu_cxx::__normal_iterator<index*,std::vector<index,std::allocator<index>>>,void>
            ((vector<index,std::allocator<index>> *)local_78,local_80,local_88,
             (allocator_type *)this_00);
  std::allocator<index>::~allocator((allocator<index> *)((long)&__range1 + 7));
  ::bucket::clear(bucket);
  __end1 = std::vector<index,_std::allocator<index>_>::begin
                     ((vector<index,_std::allocator<index>_> *)local_78);
  i = (index *)std::vector<index,_std::allocator<index>_>::end
                         ((vector<index,_std::allocator<index>_> *)local_78);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<index_*,_std::vector<index,_std::allocator<index>_>_>
                                     *)&i), bVar2) {
    piVar6 = __gnu_cxx::__normal_iterator<index_*,_std::vector<index,_std::allocator<index>_>_>::
             operator*(&__end1);
    iVar3 = hash(this,piVar6->value);
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->bucket_ids,(long)iVar3);
    if (*pvVar5 == local_50._0_4_) {
      this_00 = (bucket *)(ulong)(uint)piVar6->value;
      ::bucket::insert((bucket *)local_50,*piVar6);
    }
    else {
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->bucket_ids,(long)iVar3);
      if (*pvVar5 == bucket->id) {
        this_00 = (bucket *)(ulong)(uint)piVar6->value;
        ::bucket::insert(bucket,*piVar6);
      }
      else {
        this_00 = bucket;
        std::operator<<((ostream *)&std::cout,"error");
      }
    }
    __gnu_cxx::__normal_iterator<index_*,_std::vector<index,_std::allocator<index>_>_>::operator++
              (&__end1);
  }
  generateBucketFileName(local_320,(int)this + 8);
  _Var4 = std::operator|(_S_out,_S_bin);
  std::fstream::fstream(local_300,(string *)local_320,_Var4);
  std::__cxx11::string::~string((string *)local_320);
  ::bucket::write((bucket *)local_50,(int)local_300,__buf,(size_t)this_00);
  std::fstream::~fstream(local_300);
  std::vector<index,_std::allocator<index>_>::~vector
            ((vector<index,_std::allocator<index>_> *)local_78);
  ::bucket::~bucket((bucket *)local_50);
  return;
}

Assistant:

void directory::split(bucket &bucket, int bucket_no) {
    int local_depth, dir_depth = depth, pair_index;

    bucket.increaseDepth();

    local_depth = bucket.getDepth();

    class bucket split_bucket;

    split_bucket.id = generateBucketId(typeName);
    split_bucket.depth = local_depth;

    pair_index = pairIndex(bucket_no, local_depth);

    if(local_depth > depth) {
        grow();
        bucket_ids[bucket_no + (1 << dir_depth) ] = split_bucket.id;
    } else {
        if(bucket_no + (1 << (dir_depth - 1)) >= bucket_size) {

            bucket_ids[bucket_no ] = split_bucket.id;
        } else {

            bucket_ids[bucket_no + (1 << (dir_depth - 1)) ] = split_bucket.id;
        }
    }


    vector<index> copy = vector<index>(bucket.indices.begin(), bucket.indices.end());

    bucket.clear();

    for(auto &i: copy) {
        int _bucket_no = hash(i.value);

        if(bucket_ids[_bucket_no ] == split_bucket.id) {
            split_bucket.insert(i);
        } else if(bucket_ids[_bucket_no ] == bucket.id){
            bucket.insert(i);
        } else {
            cout << "error";
        }
    }

    fstream splitBucketFile(generateBucketFileName(typeName, split_bucket.id), OUTBIN);

    split_bucket.write(splitBucketFile);
}